

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O2

unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
__thiscall
HawkTracer::parser::make_unique<HawkTracer::parser::EventKlass,char_const(&)[9],unsigned_int>
          (parser *this,char (*args) [9],uint *args_1)

{
  EventKlass *this_00;
  allocator local_41;
  string local_40;
  
  this_00 = (EventKlass *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_40,*args,&local_41);
  EventKlass::EventKlass(this_00,&local_40,*args_1);
  *(EventKlass **)this = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}